

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall
Adjacency_Subgraph_is_parent_Test::Adjacency_Subgraph_is_parent_Test
          (Adjacency_Subgraph_is_parent_Test *this)

{
  Adjacency_Subgraph_is_parent_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Adjacency_Subgraph_is_parent_Test_001df038;
  return;
}

Assistant:

TEST(Adjacency_Subgraph, is_parent) {
  Adjacency_Subgraph subgraph;
  Adjacency_Graph graph = create_graph_structured<false>(3);
  EXPECT_TRUE(subgraph.is_parent(Adjacency_Graph<false>()));
  EXPECT_FALSE(subgraph.is_parent(graph));

  subgraph = Adjacency_Subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_FALSE(subgraph.is_parent(Adjacency_Graph<false>()));
  EXPECT_TRUE(subgraph.is_parent(graph));
}